

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZEqnArray<std::complex<double>_>,_10>::Expand
          (TPZManVector<TPZEqnArray<std::complex<double>_>,_10> *this,int64_t newsize)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong *puVar5;
  TPZEqnArray<std::complex<double>_> *this_00;
  long lVar6;
  TPZEqnArray<std::complex<double>_> *pTVar7;
  ulong in_RSI;
  long in_RDI;
  ulong uVar8;
  int64_t i;
  TPZEqnArray<std::complex<double>_> *newstore;
  TPZEqnArray<std::complex<double>_> *in_stack_ffffffffffffff58;
  TPZEqnArray<std::complex<double>_> *in_stack_ffffffffffffff60;
  TPZEqnArray<std::complex<double>_> *local_60;
  long local_30;
  
  if ((*(long *)(in_RDI + 0x18) < (long)in_RSI) && (10 < (long)in_RSI)) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = in_RSI;
    uVar4 = SUB168(auVar3 * ZEXT816(0x51d0),0);
    uVar8 = uVar4 + 8;
    if (SUB168(auVar3 * ZEXT816(0x51d0),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar8 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar8);
    *puVar5 = in_RSI;
    pTVar7 = (TPZEqnArray<std::complex<double>_> *)(puVar5 + 1);
    if (in_RSI != 0) {
      local_60 = pTVar7;
      do {
        TPZEqnArray<std::complex<double>_>::TPZEqnArray(local_60);
        local_60 = local_60 + 1;
      } while (local_60 != pTVar7 + in_RSI);
    }
    for (local_30 = 0; local_30 < *(long *)(in_RDI + 0x10); local_30 = local_30 + 1) {
      TPZEqnArray<std::complex<double>_>::operator=
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    if ((*(long *)(in_RDI + 8) != in_RDI + 0x20) && (lVar1 = *(long *)(in_RDI + 8), lVar1 != 0)) {
      this_00 = (TPZEqnArray<std::complex<double>_> *)(lVar1 + -8);
      lVar2 = *(long *)(lVar1 + -8);
      lVar6 = lVar1 + lVar2 * 0x51d0;
      while (lVar1 != lVar6) {
        lVar6 = lVar6 + -0x51d0;
        TPZEqnArray<std::complex<double>_>::~TPZEqnArray(this_00);
      }
      operator_delete__(this_00,lVar2 * 0x51d0 + 8);
    }
    *(TPZEqnArray<std::complex<double>_> **)(in_RDI + 8) = pTVar7;
    *(ulong *)(in_RDI + 0x18) = in_RSI;
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Expand(const int64_t newsize) {
    // If newsize is negative then return.
    if (newsize <= this->fNAlloc || newsize <= NumExtAlloc) {
        return;
    } else {// the size is larger than the allocated memory
        T* newstore = new T[ newsize ];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc) {
            delete [] this->fStore;
        }

        this->fStore = newstore;
        this->fNAlloc = newsize;
    }
}